

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask27_32(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar13 [64];
  
  auVar18 = vpmovsxbd_avx(ZEXT416(0x1010004));
  auVar15 = vpmovsxbd_avx(ZEXT416(0x6010012));
  auVar10 = vpmovsxbd_avx512f(_DAT_00195720);
  auVar11 = vpmovsxbd_avx512f(_DAT_001932d0);
  auVar6 = vpbroadcastd_avx512vl();
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(this + 8);
  auVar5 = vpermi2d_avx512vl(auVar18,auVar5,ZEXT416(*(uint *)(this + 4)));
  vpmovsxbd_avx2(ZEXT816(0x342c2824201c1410));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar8 = valignd_avx512vl(auVar7,auVar7,5);
  auVar10 = vpermi2d_avx512f(auVar10,ZEXT3264(auVar7),ZEXT1664(auVar5));
  auVar9 = vpbroadcastd_avx512vl();
  auVar6 = vpor_avx2(auVar6,auVar9);
  auVar18 = vpinsrd_avx((undefined1  [16])0x0,*(int *)(this + 0x30) << 4,1);
  uVar1 = *(undefined4 *)(this + 0x48);
  auVar8 = vpblendd_avx2(auVar8,ZEXT1632(auVar5),7);
  auVar8 = vpsrlvd_avx2(auVar8,_DAT_00190a00);
  auVar6 = vpblendd_avx2(auVar8,auVar6,0x10);
  auVar12 = vpmovsxbd_avx512f(_DAT_00185410);
  auVar5 = vpinsrd_avx(auVar15,auVar7._24_4_ >> 0x17,1);
  auVar5 = vpor_avx(auVar18,auVar5);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(this + 0x38);
  auVar18 = vpalignr_avx(auVar18,auVar7._16_16_,4);
  auVar10 = vpermi2d_avx512f(auVar11,auVar10,ZEXT864(*(ulong *)(this + 0x38)));
  auVar18 = vpsrlvd_avx2(auVar18,auVar15);
  auVar18 = vpblendd_avx2(auVar18,auVar5,2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(this + 0x40);
  auVar5 = vpsrlvd_avx2(auVar17,_DAT_00193800);
  auVar10 = vpermi2d_avx512f(auVar12,auVar10,ZEXT864(*(ulong *)(this + 0x40)));
  auVar11 = vpmovsxbd_avx512f(_DAT_00185430);
  auVar12 = vpbroadcastd_avx512f();
  auVar12._0_60_ = auVar10._0_60_;
  auVar10 = vpsllvd_avx512f(auVar12,_DAT_001a1e00);
  auVar11 = vpermi2d_avx512f(auVar11,ZEXT3264(auVar6),ZEXT464(*(uint *)this));
  auVar12 = vpmovsxbd_avx512f(_DAT_00185440);
  auVar6 = vpbroadcastd_avx512vl();
  auVar11 = vpermi2d_avx512f(auVar12,auVar11,ZEXT1664(auVar18));
  auVar12 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar13 = vpbroadcastd_avx512f();
  auVar14._0_52_ = auVar11._0_52_;
  auVar14._52_4_ = auVar13._52_4_;
  auVar14._56_4_ = auVar11._56_4_;
  auVar14._60_4_ = auVar11._60_4_;
  iVar2 = *(int *)(this + 0x4c);
  auVar11 = vpermi2q_avx512f(auVar12,auVar14,ZEXT1664(auVar5));
  auVar10 = vpord_avx512f(auVar10,auVar11);
  iVar3 = *(int *)(this + 0x7c);
  auVar10 = vmovdqu64_avx512f(auVar10);
  *(undefined1 (*) [64])in = auVar10;
  vpmovsxbd_avx2(ZEXT816(0x6c68705c58545060));
  auVar8 = vpblendd_avx2(ZEXT432((uint)(iVar2 * 2)),auVar6,0x20);
  auVar6 = vpmovsxbd_avx2(ZEXT816(0x507060004030201));
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)(this + (uint)(iVar3 << 5)));
  auVar18 = vpmovsxbq_avx(ZEXT216(5));
  auVar7 = vpermd_avx2(ZEXT1632(auVar18),auVar9);
  auVar18 = vpinsrd_avx(auVar7._0_16_,uVar1,0);
  auVar18 = vpsrlvd_avx2(auVar18,_DAT_0019e700);
  uVar4 = *(ulong *)(this + 0x74);
  auVar16._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar18;
  auVar16._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
  auVar8 = vpor_avx2(auVar8,auVar16);
  auVar16 = vpsrlvd_avx2(auVar9,_DAT_0019ee20);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_0019ee40);
  auVar9 = vpermd_avx2(auVar6,auVar9);
  auVar6 = vpblendd_avx2(auVar16,auVar8,0x21);
  auVar6 = vpor_avx2(auVar9,auVar6);
  *(undefined1 (*) [32])(in + 0x10) = auVar6;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar18 = vpunpckldq_avx(auVar7._0_16_,auVar15);
  auVar5 = vpsrlvd_avx2(auVar18,_DAT_00190fa0);
  auVar18 = vpsllvd_avx2(auVar15,_DAT_00191820);
  auVar18 = vpor_avx(auVar18,auVar5);
  *(long *)(in + 0x18) = auVar18._0_8_;
  in[0x1a] = iVar3 << 5 | (uint)(uVar4 >> 0x36);
  return in + 0x1b;
}

Assistant:

uint32_t *__fastpackwithoutmask27_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (27 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (27 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (27 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (27 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (27 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (27 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (27 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (27 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (27 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (27 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (27 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (27 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (27 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (27 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (27 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (27 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (27 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (27 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (27 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (27 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (27 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (27 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (27 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (27 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (27 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (27 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++out;
  ++in;

  return out;
}